

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O0

unique_ptr<rlottie::Animation,_std::default_delete<rlottie::Animation>_>
rlottie::Animation::loadFromData(string *jsonData,string *resourcePath,ColorFilter *filter)

{
  bool bVar1;
  ulong uVar2;
  shared_ptr<rlottie::internal::model::Composition> *this;
  pointer this_00;
  string *in_RDX;
  string *in_RSI;
  __uniq_ptr_data<rlottie::Animation,_std::default_delete<rlottie::Animation>,_true,_true> in_RDI;
  shared_ptr<rlottie::internal::model::Composition> composition;
  unique_ptr<rlottie::Animation,_std::default_delete<rlottie::Animation>_> *animation;
  function<void_(float_&,_float_&,_float_&)> *in_stack_ffffffffffffff08;
  function<void_(float_&,_float_&,_float_&)> *in_stack_ffffffffffffff10;
  EVP_PKEY_CTX local_b0 [23];
  undefined1 local_99;
  ColorFilter *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string local_58 [32];
  __shared_ptr local_38 [23];
  VDebug local_21 [33];
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string(local_58,in_RSI);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff88,in_RDX);
    std::function<void_(float_&,_float_&,_float_&)>::function
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    internal::model::loadFromData
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::function<void_(float_&,_float_&,_float_&)>::~function
              ((function<void_(float_&,_float_&,_float_&)> *)0x1a324c);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    std::__cxx11::string::~string(local_58);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
    if (bVar1) {
      local_99 = 0;
      this = (shared_ptr<rlottie::internal::model::Composition> *)operator_new(8);
      Animation((Animation *)0x1a3298);
      std::unique_ptr<rlottie::Animation,std::default_delete<rlottie::Animation>>::
      unique_ptr<std::default_delete<rlottie::Animation>,void>
                ((unique_ptr<rlottie::Animation,_std::default_delete<rlottie::Animation>_> *)this,
                 (pointer)in_stack_ffffffffffffff08);
      std::unique_ptr<rlottie::Animation,_std::default_delete<rlottie::Animation>_>::operator->
                ((unique_ptr<rlottie::Animation,_std::default_delete<rlottie::Animation>_> *)
                 0x1a32b1);
      this_00 = std::unique_ptr<AnimationImpl,_std::default_delete<AnimationImpl>_>::operator->
                          ((unique_ptr<AnimationImpl,_std::default_delete<AnimationImpl>_> *)
                           0x1a32b9);
      std::shared_ptr<rlottie::internal::model::Composition>::shared_ptr
                (this,(shared_ptr<rlottie::internal::model::Composition> *)in_stack_ffffffffffffff08
                );
      AnimationImpl::init(this_00,local_b0);
      std::shared_ptr<rlottie::internal::model::Composition>::~shared_ptr
                ((shared_ptr<rlottie::internal::model::Composition> *)0x1a32e9);
      local_99 = 1;
    }
    else {
      std::unique_ptr<rlottie::Animation,std::default_delete<rlottie::Animation>>::
      unique_ptr<std::default_delete<rlottie::Animation>,void>
                ((unique_ptr<rlottie::Animation,_std::default_delete<rlottie::Animation>_> *)
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    std::shared_ptr<rlottie::internal::model::Composition>::~shared_ptr
              ((shared_ptr<rlottie::internal::model::Composition> *)0x1a332c);
  }
  else {
    VDebug::operator<<(local_21,(char (*) [20])"jason data is empty");
    std::unique_ptr<rlottie::Animation,std::default_delete<rlottie::Animation>>::
    unique_ptr<std::default_delete<rlottie::Animation>,void>
              ((unique_ptr<rlottie::Animation,_std::default_delete<rlottie::Animation>_> *)
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  return (__uniq_ptr_data<rlottie::Animation,_std::default_delete<rlottie::Animation>,_true,_true>)
         (tuple<rlottie::Animation_*,_std::default_delete<rlottie::Animation>_>)
         in_RDI.super___uniq_ptr_impl<rlottie::Animation,_std::default_delete<rlottie::Animation>_>.
         _M_t.super__Tuple_impl<0UL,_rlottie::Animation_*,_std::default_delete<rlottie::Animation>_>
         .super__Head_base<0UL,_rlottie::Animation_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Animation> Animation::loadFromData(std::string jsonData,
                                                   std::string resourcePath,
                                                   ColorFilter filter)
{
    if (jsonData.empty()) {
        vWarning << "jason data is empty";
        return nullptr;
    }

    auto composition = model::loadFromData(
        std::move(jsonData), std::move(resourcePath), std::move(filter));
    if (composition) {
        auto animation = std::unique_ptr<Animation>(new Animation);
        animation->d->init(std::move(composition));
        return animation;
    }
    return nullptr;
}